

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O3

void __thiscall irr::video::CNullDriver::removeAllRenderTargets(CNullDriver *this)

{
  code *pcVar1;
  IRenderTarget *pIVar2;
  _func_int *p_Var3;
  pointer ppIVar4;
  pointer ppIVar5;
  ulong uVar6;
  
  ppIVar5 = (this->RenderTargets).m_data.
            super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppIVar4 = (this->RenderTargets).m_data.
            super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((int)((ulong)((long)ppIVar4 - (long)ppIVar5) >> 3) != 0) {
    uVar6 = 0;
    do {
      pIVar2 = ppIVar5[uVar6];
      p_Var3 = pIVar2->_vptr_IRenderTarget[0xfffffffffffffffd];
      pcVar1 = p_Var3 + 8 + (long)&(pIVar2->Textures).m_data;
      *(int *)pcVar1 = *(int *)pcVar1 + -1;
      if (*(int *)pcVar1 == 0) {
        p_Var3 = (_func_int *)((long)&pIVar2->_vptr_IRenderTarget + (long)p_Var3);
        (**(code **)(*(long *)p_Var3 + 8))(p_Var3);
        ppIVar5 = (this->RenderTargets).m_data.
                  super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppIVar4 = (this->RenderTargets).m_data.
                  super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < ((ulong)((long)ppIVar4 - (long)ppIVar5) >> 3 & 0xffffffff));
  }
  ppIVar4 = (this->RenderTargets).m_data.
            super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->RenderTargets).m_data.
  super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->RenderTargets).m_data.
  super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->RenderTargets).m_data.
  super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (ppIVar5 != (pointer)0x0) {
    operator_delete(ppIVar5,(long)ppIVar4 - (long)ppIVar5);
  }
  (this->RenderTargets).is_sorted = true;
  this->SharedRenderTarget = (IRenderTarget *)0x0;
  return;
}

Assistant:

void CNullDriver::removeAllRenderTargets()
{
	for (u32 i = 0; i < RenderTargets.size(); ++i)
		RenderTargets[i]->drop();

	RenderTargets.clear();

	SharedRenderTarget = 0;
}